

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cute_reporter_tests.c
# Opt level: O1

void setup_cute_reporter_tests(void)

{
  int iVar1;
  
  reporter = (TestReporter *)create_cute_reporter();
  iVar1 = start_cgreen_messaging(0x29a);
  reporter->ipc = iVar1;
  clear_output();
  set_cute_reporter_printer(reporter,mocked_printf);
  set_cute_reporter_vprinter(reporter,mocked_vprintf);
  return;
}

Assistant:

static void setup_cute_reporter_tests(void) {
    reporter = create_cute_reporter();

    // We can not use setup_reporting() since we are running
    // inside a test suite which needs the real reporting
    // So we'll have to set up the messaging explicitly
    reporter->ipc = start_cgreen_messaging(666);

    clear_output();
    set_cute_reporter_printer(reporter, mocked_printf);
    set_cute_reporter_vprinter(reporter, mocked_vprintf);
}